

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

htmlStatus htmlAttrAllowed(htmlElemDesc *elt,xmlChar *attr,int legacy)

{
  htmlStatus hVar1;
  int iVar2;
  htmlStatus hVar3;
  char **ppcVar4;
  
  hVar1 = HTML_INVALID;
  hVar3 = hVar1;
  if (attr != (xmlChar *)0x0 && elt != (htmlElemDesc *)0x0) {
    ppcVar4 = elt->attrs_req;
    if (ppcVar4 == (char **)0x0) {
LAB_0014ccb2:
      ppcVar4 = elt->attrs_opt;
      if (ppcVar4 == (char **)0x0) {
LAB_0014ccdd:
        hVar3 = hVar1;
        if ((legacy != 0) && (ppcVar4 = elt->attrs_depr, ppcVar4 != (char **)0x0)) {
          do {
            if ((xmlChar *)*ppcVar4 == (xmlChar *)0x0) {
              return HTML_INVALID;
            }
            iVar2 = xmlStrcmp((xmlChar *)*ppcVar4,attr);
            ppcVar4 = ppcVar4 + 1;
          } while (iVar2 != 0);
          hVar3 = HTML_DEPRECATED;
        }
      }
      else {
        hVar3 = HTML_VALID;
        do {
          if ((xmlChar *)*ppcVar4 == (xmlChar *)0x0) goto LAB_0014ccdd;
          iVar2 = xmlStrcmp((xmlChar *)*ppcVar4,attr);
          ppcVar4 = ppcVar4 + 1;
        } while (iVar2 != 0);
      }
    }
    else {
      hVar3 = HTML_REQUIRED;
      do {
        if ((xmlChar *)*ppcVar4 == (xmlChar *)0x0) goto LAB_0014ccb2;
        iVar2 = xmlStrcmp((xmlChar *)*ppcVar4,attr);
        ppcVar4 = ppcVar4 + 1;
      } while (iVar2 != 0);
    }
  }
  return hVar3;
}

Assistant:

htmlStatus
htmlAttrAllowed(const htmlElemDesc* elt, const xmlChar* attr, int legacy) {
  const char** p ;

  if ( !elt || ! attr )
	return HTML_INVALID ;

  if ( elt->attrs_req )
    for ( p = elt->attrs_req; *p; ++p)
      if ( !xmlStrcmp((const xmlChar*)*p, attr) )
        return HTML_REQUIRED ;

  if ( elt->attrs_opt )
    for ( p = elt->attrs_opt; *p; ++p)
      if ( !xmlStrcmp((const xmlChar*)*p, attr) )
        return HTML_VALID ;

  if ( legacy && elt->attrs_depr )
    for ( p = elt->attrs_depr; *p; ++p)
      if ( !xmlStrcmp((const xmlChar*)*p, attr) )
        return HTML_DEPRECATED ;

  return HTML_INVALID ;
}